

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O0

JSValue js_typed_array_get_byteOffset(JSContext *ctx,JSValue this_val,int is_dataview)

{
  JSValue this_val_00;
  undefined1 auVar1 [16];
  BOOL BVar2;
  JSObject *p_00;
  int in_ECX;
  int64_t in_RDX;
  JSValueUnion in_RSI;
  JSContext *in_RDI;
  JSTypedArray *ta;
  JSObject *p;
  JSValueUnion local_50;
  int64_t local_48;
  undefined4 uStack_2c;
  undefined4 uStack_c;
  
  this_val_00.tag = in_RDX;
  this_val_00.u.float64 = in_RSI.float64;
  p_00 = get_typed_array(in_RDI,this_val_00,in_ECX);
  if (p_00 == (JSObject *)0x0) {
    local_50.ptr = (void *)(local_50 << 0x20);
    local_48 = 6;
  }
  else {
    BVar2 = typed_array_is_detached(in_RDI,p_00);
    if (BVar2 == 0) {
      local_50._4_4_ = uStack_2c;
      local_50.int32 = ((p_00->u).bound_function)->argc;
      local_48 = 0;
    }
    else if (in_ECX == 0) {
      auVar1._4_8_ = local_48;
      auVar1._0_4_ = uStack_c;
      auVar1._12_4_ = 0;
      _local_50 = (JSValue)(auVar1 << 0x20);
      local_48 = 0;
    }
    else {
      _local_50 = JS_ThrowTypeErrorDetachedArrayBuffer((JSContext *)0x1c153a);
    }
  }
  return _local_50;
}

Assistant:

static JSValue js_typed_array_get_byteOffset(JSContext *ctx,
                                             JSValueConst this_val,
                                             int is_dataview)
{
    JSObject *p;
    JSTypedArray *ta;
    p = get_typed_array(ctx, this_val, is_dataview);
    if (!p)
        return JS_EXCEPTION;
    if (typed_array_is_detached(ctx, p)) {
        if (is_dataview) {
            return JS_ThrowTypeErrorDetachedArrayBuffer(ctx);
        } else {
            return JS_NewInt32(ctx, 0);
        }
    }
    ta = p->u.typed_array;
    return JS_NewInt32(ctx, ta->offset);
}